

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmState.cxx
# Opt level: O3

void __thiscall cmState::Snapshot::SetCurrentBinaryDirectory(Snapshot *this,string *dir)

{
  PointerType pSVar1;
  PointerType pBVar2;
  string *path;
  string local_40;
  
  pSVar1 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator->(&this->Position);
  pBVar2 = cmLinkedTree<cmState::BuildsystemDirectoryStateType>::iterator::operator->
                     (&pSVar1->BuildSystemDirectory);
  path = &pBVar2->OutputLocation;
  std::__cxx11::string::_M_assign((string *)path);
  cmsys::SystemTools::ConvertToUnixSlashes(path);
  cmsys::SystemTools::CollapseFullPath(&local_40,path);
  std::__cxx11::string::operator=((string *)path,(string *)&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  pSVar1 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator->(&this->Position);
  pBVar2 = cmLinkedTree<cmState::BuildsystemDirectoryStateType>::iterator::operator->
                     (&pSVar1->BuildSystemDirectory);
  cmsys::SystemTools::SplitPath(path,&pBVar2->CurrentBinaryDirectoryComponents,true);
  ComputeRelativePathTopBinary(this);
  return;
}

Assistant:

void cmState::Snapshot::SetCurrentBinaryDirectory(std::string const& dir)
{
  std::string& loc = this->Position->BuildSystemDirectory->OutputLocation;
  loc = dir;
  cmSystemTools::ConvertToUnixSlashes(loc);
  loc = cmSystemTools::CollapseFullPath(loc);

  cmSystemTools::SplitPath(
      loc,
      this->Position->BuildSystemDirectory->CurrentBinaryDirectoryComponents);
  this->ComputeRelativePathTopBinary();
}